

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O1

void __thiscall
Fl_Text_Buffer::add_predelete_callback
          (Fl_Text_Buffer *this,Fl_Text_Predelete_Cb bufPreDeleteCB,void *cbArg)

{
  int iVar1;
  Fl_Text_Predelete_Cb *pp_Var2;
  void **ppvVar3;
  Fl_Text_Predelete_Cb *pp_Var4;
  void **ppvVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  
  iVar1 = this->mNPredeleteProcs;
  lVar7 = (long)iVar1;
  uVar8 = 0xffffffffffffffff;
  if (-2 < lVar7) {
    uVar8 = lVar7 * 8 + 8;
  }
  pp_Var4 = (Fl_Text_Predelete_Cb *)operator_new__(uVar8);
  ppvVar5 = (void **)operator_new__(uVar8);
  if (0 < lVar7) {
    pp_Var2 = this->mPredeleteProcs;
    ppvVar3 = this->mPredeleteCbArgs;
    lVar6 = 0;
    do {
      pp_Var4[lVar6 + 1] = pp_Var2[lVar6];
      ppvVar5[lVar6 + 1] = ppvVar3[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar7 != lVar6);
  }
  if (0 < iVar1) {
    if (this->mPredeleteProcs != (Fl_Text_Predelete_Cb *)0x0) {
      operator_delete__(this->mPredeleteProcs);
    }
    if (this->mPredeleteCbArgs != (void **)0x0) {
      operator_delete__(this->mPredeleteCbArgs);
    }
  }
  *pp_Var4 = bufPreDeleteCB;
  *ppvVar5 = cbArg;
  this->mNPredeleteProcs = this->mNPredeleteProcs + 1;
  this->mPredeleteProcs = pp_Var4;
  this->mPredeleteCbArgs = ppvVar5;
  return;
}

Assistant:

void Fl_Text_Buffer::add_predelete_callback(Fl_Text_Predelete_Cb bufPreDeleteCB, 
                                            void *cbArg)
{
  Fl_Text_Predelete_Cb *newPreDeleteProcs =
  new Fl_Text_Predelete_Cb[mNPredeleteProcs + 1];
  void **newCBArgs = new void *[mNPredeleteProcs + 1];
  for (int i = 0; i < mNPredeleteProcs; i++) {
    newPreDeleteProcs[i + 1] = mPredeleteProcs[i];
    newCBArgs[i + 1] = mPredeleteCbArgs[i];
  }
  if (mNPredeleteProcs > 0) {
    delete[] mPredeleteProcs;
    delete[] mPredeleteCbArgs;
  }
  newPreDeleteProcs[0] = bufPreDeleteCB;
  newCBArgs[0] = cbArg;
  mNPredeleteProcs++;
  mPredeleteProcs = newPreDeleteProcs;
  mPredeleteCbArgs = newCBArgs;
}